

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_EqualPLTerm_Test::TestBody(ExprTest_EqualPLTerm_Test *this)

{
  ExprFactory *this_00;
  bool bVar1;
  Reference arg;
  Reference arg_00;
  PLTerm e1;
  PLTerm PVar2;
  NumericConstant e2;
  char *in_R9;
  AssertHelper AStack_b8;
  AssertHelper local_b0;
  AssertionResult gtest_ar__3;
  string local_98;
  double breaks2 [2];
  double breaks [2];
  double slopes [3];
  
  breaks[0] = 5.0;
  breaks[1] = 10.0;
  slopes[0] = -1.0;
  slopes[1] = 0.0;
  slopes[2] = 1.0;
  this_00 = &(this->super_ExprTest).factory_;
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  arg_00 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,1);
  e1 = ExprTest::MakePLTerm(&this->super_ExprTest,2,breaks,slopes,arg);
  PVar2 = ExprTest::MakePLTerm(&this->super_ExprTest,2,breaks,slopes,arg);
  bVar1 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar2.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  breaks2[0] = (double)CONCAT71(breaks2[0]._1_7_,bVar1);
  breaks2[1] = 0.0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)breaks2,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks, slopes, x))","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fc
               ,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(breaks2 + 1));
  PVar2 = ExprTest::MakePLTerm(&this->super_ExprTest,1,breaks,slopes,arg);
  bVar1 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar2.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  breaks2[0] = (double)CONCAT71(breaks2[0]._1_7_,!bVar1);
  breaks2[1] = 0.0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)breaks2,
               (AssertionResult *)"Equal(e, MakePLTerm(1, breaks, slopes, x))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fd
               ,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(breaks2 + 1));
  PVar2 = ExprTest::MakePLTerm(&this->super_ExprTest,2,breaks,slopes,arg_00);
  bVar1 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar2.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  breaks2[0] = (double)CONCAT71(breaks2[0]._1_7_,!bVar1);
  breaks2[1] = 0.0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)breaks2,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks, slopes, y))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fe
               ,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(breaks2 + 1));
  breaks2[0] = 5.0;
  breaks2[1] = 11.0;
  PVar2 = ExprTest::MakePLTerm(&this->super_ExprTest,2,breaks2,slopes,arg);
  bVar1 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar2.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  gtest_ar__3.success_ = !bVar1;
  gtest_ar__3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&AStack_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&gtest_ar__3,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks2, slopes, x))","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x300
               ,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&AStack_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__3.message_);
  e2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,42.0);
  bVar1 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)e2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                          impl_);
  gtest_ar__3.success_ = !bVar1;
  gtest_ar__3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&AStack_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&gtest_ar__3,(AssertionResult *)"Equal(e, MakeConst(42))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x301
               ,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&AStack_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__3.message_);
  return;
}

Assistant:

TEST_F(ExprTest, EqualPLTerm) {
  double breaks[] = {5, 10};
  double slopes[] = {-1, 0, 1};
  mp::Reference x = MakeVariable(0), y = MakeVariable(1);
  NumericExpr e = MakePLTerm(2, breaks, slopes, x);
  EXPECT_TRUE(Equal(e, MakePLTerm(2, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(1, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks, slopes, y)));
  double breaks2[] = {5, 11};
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks2, slopes, x)));
  EXPECT_FALSE(Equal(e, MakeConst(42)));
}